

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderIntegerFunctionTests::init
          (ShaderIntegerFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ShaderIntegerFunctionTests *this_local;
  
  addFunctionCases<deqp::gles31::Functional::UaddCarryCase>
            (&this->super_TestCaseGroup,"uaddcarry",false,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::UsubBorrowCase>
            (&this->super_TestCaseGroup,"usubborrow",false,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::UmulExtendedCase>
            (&this->super_TestCaseGroup,"umulextended",false,true,false,0x3f);
  addFunctionCases<deqp::gles31::Functional::ImulExtendedCase>
            (&this->super_TestCaseGroup,"imulextended",true,false,false,0x3f);
  addFunctionCases<deqp::gles31::Functional::BitfieldExtractCase>
            (&this->super_TestCaseGroup,"bitfieldextract",true,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::BitfieldInsertCase>
            (&this->super_TestCaseGroup,"bitfieldinsert",true,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::BitfieldReverseCase>
            (&this->super_TestCaseGroup,"bitfieldreverse",true,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::BitCountCase>
            (&this->super_TestCaseGroup,"bitcount",true,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::FindLSBCase>
            (&this->super_TestCaseGroup,"findlsb",true,true,true,0x3f);
  addFunctionCases<deqp::gles31::Functional::FindMSBCase>
            (&this->super_TestCaseGroup,"findmsb",true,true,true,0x3f);
  return extraout_EAX;
}

Assistant:

void ShaderIntegerFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS
	};

	//																		Int?	Uint?	AllPrec?	Shaders
	addFunctionCases<UaddCarryCase>				(this,	"uaddcarry",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UsubBorrowCase>			(this,	"usubborrow",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UmulExtendedCase>			(this,	"umulextended",		false,	true,	false,		ALL_SHADERS);
	addFunctionCases<ImulExtendedCase>			(this,	"imulextended",		true,	false,	false,		ALL_SHADERS);
	addFunctionCases<BitfieldExtractCase>		(this,	"bitfieldextract",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldInsertCase>		(this,	"bitfieldinsert",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldReverseCase>		(this,	"bitfieldreverse",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitCountCase>				(this,	"bitcount",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindLSBCase>				(this,	"findlsb",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindMSBCase>				(this,	"findmsb",			true,	true,	true,		ALL_SHADERS);
}